

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_encode(NTRUEncodeSchedule *sched,uint16_t *rs_in,BinarySink *bs)

{
  uint *puVar1;
  size_t factor1;
  void *b;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  size_t i;
  size_t sVar6;
  ulong uVar7;
  
  factor1 = sched->nvals;
  b = safemalloc(factor1,4,0);
  for (sVar6 = 0; factor1 != sVar6; sVar6 = sVar6 + 1) {
    *(uint *)((long)b + sVar6 * 4) = (uint)rs_in[sVar6];
  }
  sVar6 = factor1 - 1;
  sVar3 = 0;
  for (uVar7 = 0; uVar7 < sched->nops; uVar7 = uVar7 + 1) {
    if ((short)sched->ops[uVar7] == 0) {
      sVar5 = (sVar3 + 1) % factor1;
      sVar6 = (sVar6 + 1) % factor1;
      *(undefined4 *)((long)b + sVar6 * 4) = *(undefined4 *)((long)b + sVar3 * 4);
    }
    else {
      uVar4 = sched->ops[uVar7] & 0xffff;
      if (uVar4 == 1) {
        BinarySink_put_byte(bs->binarysink_,*(uchar *)((long)b + sVar6 * 4));
        puVar1 = (uint *)((long)b + sVar6 * 4);
        *puVar1 = *puVar1 >> 8;
        sVar5 = sVar3;
      }
      else {
        uVar2 = (sVar3 + 1) % factor1;
        sVar5 = uVar2 + 1;
        if (sVar5 == factor1) {
          sVar5 = 0;
        }
        sVar6 = (sVar6 + 1) % factor1;
        *(uint *)((long)b + sVar6 * 4) =
             (uVar4 - 2) * *(int *)((long)b + uVar2 * 4) + *(int *)((long)b + sVar3 * 4);
      }
    }
    sVar3 = sVar5;
  }
  if (sVar3 != sched->endpos) {
    __assert_fail("head == sched->endpos",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x316,"void ntru_encode(NTRUEncodeSchedule *, const uint16_t *, BinarySink *)");
  }
  if (sVar6 != sVar3) {
    __assert_fail("tail == sched->endpos",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x317,"void ntru_encode(NTRUEncodeSchedule *, const uint16_t *, BinarySink *)");
  }
  if (*(int *)((long)b + sVar6 * 4) == 0) {
    smemclr(b,factor1 << 2);
    safefree(b);
    return;
  }
  __assert_fail("rs[head] == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                0x318,"void ntru_encode(NTRUEncodeSchedule *, const uint16_t *, BinarySink *)");
}

Assistant:

void ntru_encode(NTRUEncodeSchedule *sched, const uint16_t *rs_in,
                 BinarySink *bs)
{
    size_t n = sched->nvals;
    uint32_t *rs = snewn(n, uint32_t);
    for (size_t i = 0; i < n; i++)
        rs[i] = rs_in[i];

    /*
     * The head and tail pointers of the queue are both 'full'. That
     * is, rs[head] is the first element actually in the queue, and
     * rs[tail] is the last element.
     *
     * So you append to the queue by first advancing 'tail' and then
     * writing to rs[tail], whereas you consume from the queue by
     * first reading rs[head] and _then_ advancing 'head'.
     *
     * The more normal thing would be to make 'tail' point to the
     * first empty slot instead of the last full one. But then you'd
     * have to faff about with modular arithmetic to find the last
     * full slot for the BYTE command, so in this case, it's easier to
     * do it the less usual way.
     */
    size_t head = 0, tail = n-1;

    for (size_t i = 0; i < sched->nops; i++) {
        uint16_t op = sched->ops[i];
        switch (op) {
          case ENC_BYTE:
            put_byte(bs, rs[tail] & 0xFF);
            rs[tail] >>= 8;
            break;
          case ENC_COPY: {
            uint32_t r = rs[head];
            head = (head + 1) % n;
            tail = (tail + 1) % n;
            rs[tail] = r;
            break;
          }
          default: {
            uint32_t r1 = rs[head];
            head = (head + 1) % n;
            uint32_t r2 = rs[head];
            head = (head + 1) % n;
            tail = (tail + 1) % n;
            rs[tail] = r1 + (op - ENC_COMBINE_BASE) * r2;
            break;
          }
        }
    }

    /*
     * Expect that we've ended up with a single zero in the queue, at
     * exactly the position that the setup-time analysis predicted it.
     */
    assert(head == sched->endpos);
    assert(tail == sched->endpos);
    assert(rs[head] == 0);

    smemclr(rs, n * sizeof(*rs));
    sfree(rs);
}